

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.h
# Opt level: O0

cmCommand * __thiscall cmGetPropertyCommand::Clone(cmGetPropertyCommand *this)

{
  cmGetPropertyCommand *this_00;
  cmGetPropertyCommand *this_local;
  
  this_00 = (cmGetPropertyCommand *)operator_new(0x98);
  cmGetPropertyCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() CM_OVERRIDE { return new cmGetPropertyCommand; }